

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

void __thiscall Clasp::PBBuilder::PBBuilder(PBBuilder *this)

{
  SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject> *this_00;
  undefined8 *in_RDI;
  ProductIndex *in_stack_ffffffffffffffb8;
  ProgramBuilder *in_stack_ffffffffffffffc0;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_01;
  
  ProgramBuilder::ProgramBuilder(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__PBBuilder_002de468;
  this_01 = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 4);
  SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject> *)this_01);
  PKey::PKey((PKey *)0x1cb0da);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector(this_01);
  *(undefined4 *)(in_RDI + 9) = 1;
  this_00 = (SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject> *)
            operator_new(0x58);
  this_00[8].ptr_ = 0;
  this_00[9].ptr_ = 0;
  this_00[6].ptr_ = 0;
  this_00[7].ptr_ = 0;
  this_00[4].ptr_ = 0;
  this_00[5].ptr_ = 0;
  this_00[2].ptr_ = 0;
  this_00[3].ptr_ = 0;
  this_00->ptr_ = 0;
  this_00[1].ptr_ = 0;
  this_00[10].ptr_ = 0;
  ProductIndex::ProductIndex((ProductIndex *)0x1cb136);
  SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject>::operator=
            (this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

PBBuilder::PBBuilder() : auxVar_(1) {
	products_ = new ProductIndex();
}